

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
          (QMovableArrayOps<EnumDef> *this,qsizetype i,EnumDef *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  EnumDef *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  EnumDef tmp;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  byte bVar6;
  EnumDef *this_00;
  Inserter local_98;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<EnumDef>::needsDetach((QArrayDataPointer<EnumDef> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->name).d.size) &&
       (qVar3 = QArrayDataPointer<EnumDef>::freeSpaceAtEnd
                          ((QArrayDataPointer<EnumDef> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                                   CONCAT24(in_stack_ffffffffffffff4c,
                                                            in_stack_ffffffffffffff48)))),
       qVar3 != 0)) {
      QArrayDataPointer<EnumDef>::end((QArrayDataPointer<EnumDef> *)in_RDI);
      EnumDef::EnumDef(in_RDI,(EnumDef *)
                              CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
      goto LAB_001202a8;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<EnumDef>::freeSpaceAtBegin
                          ((QArrayDataPointer<EnumDef> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                                   CONCAT24(in_stack_ffffffffffffff4c,
                                                            in_stack_ffffffffffffff48)))),
       qVar3 != 0)) {
      QArrayDataPointer<EnumDef>::begin((QArrayDataPointer<EnumDef> *)0x12017a);
      EnumDef::EnumDef(in_RDI,(EnumDef *)
                              CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      (in_RDI->name).d.ptr = (in_RDI->name).d.ptr + -0x68;
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
      goto LAB_001202a8;
    }
  }
  memset(local_70,0xaa,0x68);
  EnumDef::EnumDef(in_RDI,(EnumDef *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  bVar4 = (in_RDI->name).d.size != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<EnumDef>::detachAndGrow
            ((QArrayDataPointer<EnumDef> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (EnumDef **)CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff4c,uVar2))),
             (QArrayDataPointer<EnumDef> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<EnumDef> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff4c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff38));
    Inserter::insertOne((Inserter *)in_RDI,(EnumDef *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
    Inserter::~Inserter(&local_98);
  }
  else {
    QArrayDataPointer<EnumDef>::begin((QArrayDataPointer<EnumDef> *)0x12023c);
    EnumDef::EnumDef(in_RDI,(EnumDef *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
    (in_RDI->name).d.ptr = (in_RDI->name).d.ptr + -0x68;
    (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
  }
  EnumDef::~EnumDef(in_RDI);
LAB_001202a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }